

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# theory_data.cpp
# Opt level: O3

void __thiscall Potassco::TheoryData::reset(TheoryData *this)

{
  void *pvVar1;
  void *pvVar2;
  ulong uVar3;
  long lVar4;
  TheoryTerm *t;
  Data *pDVar5;
  DestroyT local_29;
  
  pDVar5 = this->data_;
  uVar3 = (pDVar5->terms).top >> 3 & 0xffffffff;
  if (uVar3 != 0) {
    t = (TheoryTerm *)(pDVar5->terms).mem.beg_;
    lVar4 = uVar3 << 3;
    do {
      DestroyT::operator()(&local_29,t);
      t = t + 1;
      lVar4 = lVar4 + -8;
    } while (lVar4 != 0);
    pDVar5 = this->data_;
  }
  uVar3 = (pDVar5->elems).top >> 3 & 0xffffffff;
  if (uVar3 != 0) {
    pvVar1 = (pDVar5->elems).mem.beg_;
    lVar4 = 0;
    do {
      pvVar2 = *(void **)((long)pvVar1 + lVar4);
      if (pvVar2 != (void *)0x0) {
        operator_delete(pvVar2);
      }
      lVar4 = lVar4 + 8;
    } while (uVar3 * 8 != lVar4);
    pDVar5 = this->data_;
  }
  uVar3 = (pDVar5->atoms).top >> 3 & 0xffffffff;
  if (uVar3 != 0) {
    pvVar1 = (pDVar5->atoms).mem.beg_;
    lVar4 = 0;
    do {
      pvVar2 = *(void **)((long)pvVar1 + lVar4);
      if (pvVar2 != (void *)0x0) {
        operator_delete(pvVar2);
      }
      lVar4 = lVar4 + 8;
    } while (uVar3 * 8 != lVar4);
    pDVar5 = this->data_;
  }
  MemoryRegion::release((MemoryRegion *)pDVar5);
  (pDVar5->atoms).top = 0;
  pDVar5 = this->data_;
  MemoryRegion::release(&(pDVar5->elems).mem);
  (pDVar5->elems).top = 0;
  pDVar5 = this->data_;
  MemoryRegion::release(&(pDVar5->terms).mem);
  (pDVar5->terms).top = 0;
  pDVar5 = this->data_;
  (pDVar5->frame).atom = 0;
  (pDVar5->frame).term = 0;
  (pDVar5->frame).elem = 0;
  return;
}

Assistant:

void TheoryData::reset() {
	DestroyT destroy;
	std::for_each(terms(), terms() + numTerms(), destroy);
	std::for_each(elems(), elems() + numElems(), destroy);
	std::for_each(atoms(), atoms() + numAtoms(), destroy);
	data_->atoms.reset();
	data_->elems.reset();
	data_->terms.reset();
	data_->frame = Data::Up();
}